

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_gui.cpp
# Opt level: O2

Uint32 getpixel(SDL_Surface *surface,int x,int y)

{
  byte bVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  bVar1 = surface->format->BytesPerPixel;
  if (bVar1 - 1 < 4) {
    lVar3 = (long)y * (long)surface->pitch;
    pvVar2 = surface->pixels;
    lVar4 = (long)x * (ulong)bVar1;
    switch((uint)bVar1) {
    case 1:
      return (Uint32)*(byte *)((long)pvVar2 + lVar4 + lVar3);
    case 2:
      return (Uint32)*(ushort *)((long)pvVar2 + lVar4 + lVar3);
    case 3:
      return (uint)CONCAT12(*(undefined1 *)((long)pvVar2 + lVar4 + lVar3 + 2),
                            *(undefined2 *)((long)pvVar2 + lVar4 + lVar3));
    case 4:
      return *(Uint32 *)((long)pvVar2 + lVar4 + lVar3);
    }
  }
  return 0;
}

Assistant:

Uint32 getpixel(SDL_Surface *surface, int x, int y) {
    int bpp = surface->format->BytesPerPixel;
    Uint8 *p = (Uint8 *) surface->pixels + y * surface->pitch + x * bpp;

    switch (bpp) {
        case 1:
            return *p;
        case 2:
            return *(Uint16 *) p;
        case 3:
            if (SDL_BYTEORDER == SDL_BIG_ENDIAN)
                return p[0] << 16 | p[1] << 8 | p[2];
            else
                return p[0] | p[1] << 8 | p[2] << 16;
        case 4:
            return *(Uint32 *) p;
            break;
        default:
            return 0;
    }
}